

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O1

void * __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::lock
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this,E_TEXTURE_LOCK_MODE mode,
          u32 mipmapLevel,u32 layer,E_TEXTURE_LOCK_FLAGS lockFlags)

{
  GLenum GVar1;
  u32 uVar2;
  GLenum GVar3;
  void *pvVar4;
  IImage *pIVar5;
  ulong __n;
  u8 *__src;
  u8 *__src_00;
  uint uVar6;
  dimension2d<unsigned_int> lockImageSize;
  
  if (this->LockImage == (IImage *)0x0) {
    this->LockReadOnly = (bool)(this->LockReadOnly | mode == ETLM_READ_ONLY);
    this->LockLayer = layer;
    this->MipLevelStored = (u8)mipmapLevel;
    if ((this->KeepImage == true) &&
       ((mipmapLevel == 0 ||
        ((pIVar5 = (this->Images).m_data.
                   super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[layer], pIVar5 != (IImage *)0x0 &&
         (pvVar4 = IImage::getMipMapsData(pIVar5,mipmapLevel), pvVar4 != (void *)0x0)))))) {
      pIVar5 = (this->Images).m_data.
               super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
               _M_impl.super__Vector_impl_data._M_start[this->LockLayer];
      this->LockImage = pIVar5;
      *(int *)(pIVar5->_vptr_IImage[-3] + 4 + (long)&(pIVar5->Size).Width) =
           *(int *)(pIVar5->_vptr_IImage[-3] + 4 + (long)&(pIVar5->Size).Width) + 1;
    }
    if (this->LockImage == (IImage *)0x0) {
      IImage::getMipMapsSize(&(this->super_ITexture).Size,(uint)this->MipLevelStored);
      pIVar5 = (IImage *)(**(code **)(**(long **)&(this->super_ITexture).field_0x78 + 0x250))();
      this->LockImage = pIVar5;
      if ((mode != ETLM_WRITE_ONLY) && (pIVar5 != (IImage *)0x0)) {
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::STextureCache::set
                  ((STextureCache *)
                   (*(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0xbe8) + 0x10),0,
                   &this->super_ITexture,EST_ACTIVE_ALWAYS);
        GVar1 = *(GLenum *)&(this->super_ITexture).field_0x80;
        GVar3 = layer + 0x8515;
        if (GVar1 != 0x8513) {
          GVar3 = GVar1;
        }
        (*GL.GetTexImage)(GVar3,(GLint)this->MipLevelStored,
                          *(GLenum *)&(this->super_ITexture).field_0x8c,this->PixelType,pIVar5->Data
                         );
        if ((lockFlags == ETLF_FLIP_Y_UP_RTT) && ((this->super_ITexture).IsRenderTarget != false)) {
          uVar2 = pIVar5->Pitch;
          __n = (ulong)(int)uVar2;
          __src = pIVar5->Data;
          uVar6 = (pIVar5->Size).Height;
          pvVar4 = operator_new__(__n);
          if ((pIVar5->Size).Height != 0) {
            __src_00 = __src + (uVar6 - 1) * uVar2;
            uVar6 = 0;
            do {
              memcpy(pvVar4,__src,__n);
              memcpy(__src,__src_00,__n);
              memcpy(__src_00,pvVar4,__n);
              __src = __src + __n;
              __src_00 = __src_00 + -__n;
              uVar6 = uVar6 + 2;
            } while (uVar6 < (pIVar5->Size).Height);
          }
          operator_delete__(pvVar4);
        }
      }
    }
    if (this->LockImage == (IImage *)0x0) {
      return (void *)0x0;
    }
  }
  pvVar4 = getLockImageData(this,(uint)this->MipLevelStored);
  return pvVar4;
}

Assistant:

void *lock(E_TEXTURE_LOCK_MODE mode = ETLM_READ_WRITE, u32 mipmapLevel = 0, u32 layer = 0, E_TEXTURE_LOCK_FLAGS lockFlags = ETLF_FLIP_Y_UP_RTT) override
	{
		if (LockImage)
			return getLockImageData(MipLevelStored);

		if (IImage::isCompressedFormat(ColorFormat))
			return 0;

		LockReadOnly |= (mode == ETLM_READ_ONLY);
		LockLayer = layer;
		MipLevelStored = mipmapLevel;

		if (KeepImage) {
			_IRR_DEBUG_BREAK_IF(LockLayer > Images.size())

			if (mipmapLevel == 0 || (Images[LockLayer] && Images[LockLayer]->getMipMapsData(mipmapLevel))) {
				LockImage = Images[LockLayer];
				LockImage->grab();
			}
		}

		if (!LockImage) {
			core::dimension2d<u32> lockImageSize(IImage::getMipMapsSize(Size, MipLevelStored));

			// note: we save mipmap data also in the image because IImage doesn't allow saving single mipmap levels to the mipmap data
			LockImage = Driver->createImage(ColorFormat, lockImageSize);

			if (LockImage && mode != ETLM_WRITE_ONLY) {
				bool passed = true;

#ifdef IRR_COMPILE_GL_COMMON
				IImage *tmpImage = LockImage; // not sure yet if the size required by glGetTexImage is always correct, if not we might have to allocate a different tmpImage and convert colors later on.

				Driver->getCacheHandler()->getTextureCache().set(0, this);
				Driver->testGLError(__LINE__);

				GLenum tmpTextureType = TextureType;

				if (tmpTextureType == GL_TEXTURE_CUBE_MAP) {
					_IRR_DEBUG_BREAK_IF(layer > 5)

					tmpTextureType = GL_TEXTURE_CUBE_MAP_POSITIVE_X + layer;
				}

				GL.GetTexImage(tmpTextureType, MipLevelStored, PixelFormat, PixelType, tmpImage->getData());
				Driver->testGLError(__LINE__);

				if (IsRenderTarget && lockFlags == ETLF_FLIP_Y_UP_RTT) {
					const s32 pitch = tmpImage->getPitch();

					u8 *srcA = static_cast<u8 *>(tmpImage->getData());
					u8 *srcB = srcA + (tmpImage->getDimension().Height - 1) * pitch;

					u8 *tmpBuffer = new u8[pitch];

					for (u32 i = 0; i < tmpImage->getDimension().Height; i += 2) {
						memcpy(tmpBuffer, srcA, pitch);
						memcpy(srcA, srcB, pitch);
						memcpy(srcB, tmpBuffer, pitch);
						srcA += pitch;
						srcB -= pitch;
					}

					delete[] tmpBuffer;
				}
#elif (defined(IRR_COMPILE_GLES2_COMMON) || defined(IRR_COMPILE_GLES_COMMON))
				// TODO: on ES2 we can likely also work with glCopyTexImage2D instead of rendering which should be faster.
				COpenGLCoreTexture *tmpTexture = new COpenGLCoreTexture("OGL_CORE_LOCK_TEXTURE", Size, ETT_2D, ColorFormat, Driver);

				GLuint tmpFBO = 0;
				Driver->irrGlGenFramebuffers(1, &tmpFBO);

				GLint prevViewportX = 0;
				GLint prevViewportY = 0;
				GLsizei prevViewportWidth = 0;
				GLsizei prevViewportHeight = 0;
				Driver->getCacheHandler()->getViewport(prevViewportX, prevViewportY, prevViewportWidth, prevViewportHeight);
				Driver->getCacheHandler()->setViewport(0, 0, Size.Width, Size.Height);

				GLuint prevFBO = 0;
				Driver->getCacheHandler()->getFBO(prevFBO);
				Driver->getCacheHandler()->setFBO(tmpFBO);

				Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tmpTexture->getOpenGLTextureName(), 0);

				GL.Clear(GL_COLOR_BUFFER_BIT);

				Driver->draw2DImage(this, layer, true);

				IImage *tmpImage = Driver->createImage(ECF_A8R8G8B8, Size);
				GL.ReadPixels(0, 0, Size.Width, Size.Height, GL_RGBA, GL_UNSIGNED_BYTE, tmpImage->getData());

				Driver->getCacheHandler()->setFBO(prevFBO);
				Driver->getCacheHandler()->setViewport(prevViewportX, prevViewportY, prevViewportWidth, prevViewportHeight);

				Driver->irrGlDeleteFramebuffers(1, &tmpFBO);
				delete tmpTexture;

				void *src = tmpImage->getData();
				void *dest = LockImage->getData();

				switch (ColorFormat) {
				case ECF_A1R5G5B5:
					CColorConverter::convert_A8R8G8B8toA1B5G5R5(src, tmpImage->getDimension().getArea(), dest);
					break;
				case ECF_R5G6B5:
					CColorConverter::convert_A8R8G8B8toR5G6B5(src, tmpImage->getDimension().getArea(), dest);
					break;
				case ECF_R8G8B8:
					CColorConverter::convert_A8R8G8B8toB8G8R8(src, tmpImage->getDimension().getArea(), dest);
					break;
				case ECF_A8R8G8B8:
					CColorConverter::convert_A8R8G8B8toA8B8G8R8(src, tmpImage->getDimension().getArea(), dest);
					break;
				default:
					passed = false;
					break;
				}
				tmpImage->drop();
#endif

				if (!passed) {
					LockImage->drop();
					LockImage = 0;
				}
			}

			Driver->testGLError(__LINE__);
		}

		return (LockImage) ? getLockImageData(MipLevelStored) : 0;
	}